

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  uint local_3c;
  int iStack_38;
  int n;
  int arr [5];
  char **argv_local;
  int argc_local;
  
  _iStack_38 = 0x200000001;
  arr[0] = 4;
  arr[1] = 4;
  arr[2] = 5;
  printf("Array is [%d, %d, %d, %d, %d].\n",1,2,4,4,5);
  for (local_3c = 1; (int)local_3c < 6; local_3c = local_3c + 1) {
    _Var1 = is_in_array(&iStack_38,5,local_3c);
    if (_Var1) {
      printf("%d is in the array.\n",(ulong)local_3c);
    }
    else {
      printf("%d is not in the array.\n",(ulong)local_3c);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const int arr[ARR_LEN] = {1, 2, 4, 4, 5};
  printf("Array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);

  for (int n = 1; n <= 5; n++) {
    if (is_in_array(arr, ARR_LEN, n)) {
      printf("%d is in the array.\n", n);
    } else {
      printf("%d is not in the array.\n", n);
    }
  }

  return 0;
}